

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhoc_agent_wrapper.cpp
# Opt level: O0

exception_reaction_t __thiscall
so_5::adhoc_agent_wrapper_t::so_exception_reaction(adhoc_agent_wrapper_t *this)

{
  adhoc_agent_wrapper_t *this_local;
  
  if (this->m_exception_reaction == inherit_exception_reaction) {
    this_local._4_4_ = agent_t::so_exception_reaction(&this->super_agent_t);
  }
  else {
    this_local._4_4_ = this->m_exception_reaction;
  }
  return this_local._4_4_;
}

Assistant:

exception_reaction_t
adhoc_agent_wrapper_t::so_exception_reaction() const
	{
		if( exception_reaction_t::inherit_exception_reaction !=
				m_exception_reaction )
			return m_exception_reaction;
		else
			// Let's basic implementation handle this case.
			return agent_t::so_exception_reaction();
	}